

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O1

void __thiscall
HACD::RMNode::Create(RMNode *this,size_t depth,size_t maxDepth,size_t minLeafSize,Float minAxisSize)

{
  size_t sVar1;
  RMNode *this_00;
  SArray<long,_16UL> *this_01;
  double dVar2;
  undefined1 auVar3 [16];
  RaycastMesh *pRVar4;
  size_t sVar5;
  RMNode *pRVar6;
  Vec3<long> *pVVar7;
  Vec3<double> *pVVar8;
  long *plVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  byte bVar16;
  int k;
  long lVar17;
  SArray<long,_16UL> *pSVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  long f;
  long pts [3];
  long local_50;
  long local_48 [3];
  
  ComputeBB(this);
  if ((depth != maxDepth) && (uVar22 = (this->m_triIDs).m_size, minLeafSize < uVar22)) {
    dVar2 = (this->m_bBox).m_min.m_data[0];
    dVar11 = (this->m_bBox).m_max.m_data[0] - dVar2;
    dVar12 = (this->m_bBox).m_max.m_data[1] - (this->m_bBox).m_min.m_data[1];
    dVar13 = (this->m_bBox).m_max.m_data[2] - (this->m_bBox).m_min.m_data[2];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar13;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar12;
    auVar25 = vmaxsd_avx(auVar25,auVar26);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar11;
    auVar25 = vmaxsd_avx(auVar25,auVar24);
    dVar27 = auVar25._0_8_;
    if (minAxisSize <= dVar27) {
      uVar14 = vcmppd_avx512vl(auVar24,auVar25,4);
      uVar15 = vcmppd_avx512vl(auVar26,auVar25,0);
      bVar16 = (byte)uVar14 & 3 & (byte)uVar15;
      uVar20 = (ulong)(((byte)~bVar16 & 1) << 3);
      lVar19 = uVar20 + 0x20;
      lVar17 = 0x18;
      if (dVar11 != dVar27) {
        lVar17 = lVar19;
      }
      if (NAN(dVar11) || NAN(dVar27)) {
        lVar17 = lVar19;
      }
      lVar21 = uVar20 + 0x38;
      bVar10 = dVar11 != dVar27;
      pRVar4 = this->m_rm;
      sVar5 = pRVar4->m_nNodes;
      lVar19 = 0x30;
      if (bVar10) {
        lVar19 = lVar21;
      }
      if (NAN(dVar11) || NAN(dVar27)) {
        lVar19 = lVar21;
      }
      sVar1 = sVar5 + 1;
      pRVar4->m_nNodes = sVar1;
      this->m_idLeft = sVar5;
      pRVar4->m_nNodes = sVar5 + 2;
      this->m_idRight = sVar1;
      pRVar6 = pRVar4->m_nodes;
      this_00 = pRVar6 + sVar5;
      this_01 = &pRVar6[sVar5].m_triIDs;
      *(size_t *)((long)(this_01 + -1) + 0x50) = sVar5;
      *(size_t *)((long)(this_01 + 1) + 0x10) = sVar1;
      *(double *)((long)(this_01 + -1) + 0x68) = dVar2;
      *(double *)((long)(this_01 + -1) + 0x70) = (this->m_bBox).m_min.m_data[1];
      *(double *)((long)(this_01 + -1) + 0x78) = (this->m_bBox).m_min.m_data[2];
      *(double *)((long)(this_01 + -1) + 0x80) = (this->m_bBox).m_max.m_data[0];
      *(double *)((long)(this_01 + -1) + 0x88) = (this->m_bBox).m_max.m_data[1];
      *(double *)((long)(this_01 + -1) + 0x90) = (this->m_bBox).m_max.m_data[2];
      *(double *)((long)(this_01 + 1) + 0x28) = (this->m_bBox).m_min.m_data[0];
      *(double *)((long)(this_01 + 1) + 0x30) = (this->m_bBox).m_min.m_data[1];
      *(double *)((long)(this_01 + 1) + 0x38) = (this->m_bBox).m_min.m_data[2];
      *(double *)((long)(this_01 + 1) + 0x40) = (this->m_bBox).m_max.m_data[0];
      *(double *)((long)(this_01 + 1) + 0x48) = (this->m_bBox).m_max.m_data[1];
      *(double *)((long)(this_01 + 1) + 0x50) = (this->m_bBox).m_max.m_data[2];
      *(RaycastMesh **)(this_01 + 1) = pRVar4;
      *(RaycastMesh **)((long)(this_01 + 2) + 0x58) = this->m_rm;
      auVar23._0_8_ =
           (ulong)bVar10 *
           ((ulong)(bVar16 & 1) * (long)dVar12 + (ulong)!(bool)(bVar16 & 1) * (long)dVar13) +
           (ulong)!bVar10 * (long)dVar11;
      auVar23._8_8_ = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)((long)(&(this_00->m_bBox).m_min + -1) + lVar19);
      auVar25 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),auVar23,auVar3);
      *(long *)((long)(&(this_00->m_bBox).m_min + -1) + lVar19) = auVar25._0_8_;
      *(long *)((long)(&this_00[1].m_bBox.m_min + -1) + lVar17) = auVar25._0_8_;
      pVVar7 = this->m_rm->m_triangles;
      pVVar8 = this->m_rm->m_vertices;
      SArray<long,_16UL>::Resize(this_01,uVar22);
      SArray<long,_16UL>::Resize(&pRVar6[sVar5 + 1].m_triIDs,(this->m_triIDs).m_size);
      if ((this->m_triIDs).m_size == 0) {
LAB_0085a9b7:
        Create(this_00 + 1,depth + 1,maxDepth,minLeafSize,minAxisSize);
        Create(this_00,depth + 1,maxDepth,minLeafSize,minAxisSize);
        (this->m_triIDs).m_size = 0;
        plVar9 = (this->m_triIDs).m_data;
        if (plVar9 != (long *)0x0) {
          operator_delete__(plVar9);
        }
        (this->m_triIDs).m_data = (long *)0x0;
        (this->m_triIDs).m_maxSize = 0x10;
        return;
      }
      uVar22 = 0;
LAB_0085a889:
      pSVar18 = &this->m_triIDs;
      if ((this->m_triIDs).m_maxSize != 0x10) {
        pSVar18 = (SArray<long,_16UL> *)(this->m_triIDs).m_data;
      }
      local_50 = pSVar18->m_data0[uVar22];
      local_48[0] = pVVar7[local_50].m_data[0];
      local_48[1] = pVVar7[local_50].m_data[1];
      local_48[2] = pVVar7[local_50].m_data[2];
      lVar19 = 0;
      do {
        lVar17 = local_48[lVar19];
        if ((((pVVar8[lVar17].m_data[0] <= (this_00->m_bBox).m_max.m_data[0]) &&
             ((this_00->m_bBox).m_min.m_data[0] <= pVVar8[lVar17].m_data[0])) &&
            (pVVar8[lVar17].m_data[1] <= (this_00->m_bBox).m_max.m_data[1])) &&
           ((((this_00->m_bBox).m_min.m_data[1] <= pVVar8[lVar17].m_data[1] &&
             (pVVar8[lVar17].m_data[2] <= (this_00->m_bBox).m_max.m_data[2])) &&
            (pSVar18 = this_01, (this_00->m_bBox).m_min.m_data[2] <= pVVar8[lVar17].m_data[2]))))
        goto LAB_0085a9a7;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      lVar19 = 0;
      do {
        lVar17 = local_48[lVar19];
        if (((pVVar8[lVar17].m_data[0] <= this_00[1].m_bBox.m_max.m_data[0]) &&
            (this_00[1].m_bBox.m_min.m_data[0] <= pVVar8[lVar17].m_data[0])) &&
           ((pVVar8[lVar17].m_data[1] <= this_00[1].m_bBox.m_max.m_data[1] &&
            (((this_00[1].m_bBox.m_min.m_data[1] <= pVVar8[lVar17].m_data[1] &&
              (pVVar8[lVar17].m_data[2] <= this_00[1].m_bBox.m_max.m_data[2])) &&
             (pSVar18 = &pRVar6[sVar5 + 1].m_triIDs,
             this_00[1].m_bBox.m_min.m_data[2] <= pVVar8[lVar17].m_data[2])))))) goto LAB_0085a9a7;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 3);
      goto LAB_0085a989;
    }
  }
  this->m_leaf = true;
  return;
LAB_0085a9a7:
  SArray<long,_16UL>::PushBack(pSVar18,&local_50);
LAB_0085a989:
  uVar22 = uVar22 + 1;
  if ((this->m_triIDs).m_size <= uVar22) goto LAB_0085a9b7;
  goto LAB_0085a889;
}

Assistant:

void RMNode::Create(size_t depth, size_t maxDepth, size_t minLeafSize, Float minAxisSize)
	{
		ComputeBB();
		Vec3<Float> d = m_bBox.m_max - m_bBox.m_min;
		Float maxDiff = std::max<Float>(d.X(), std::max<Float>(d.Y(), d.Z()));
		RMSplitAxis split;
		if		(d.X() == maxDiff) split = RMSplitAxis_X;
		else if (d.Y() == maxDiff) split = RMSplitAxis_Y;
		else					   split = RMSplitAxis_Z;
	
		if (depth == maxDepth || minLeafSize >= m_triIDs.Size() || maxDiff < minAxisSize)
		{
			m_leaf = true;
			return;
		}
		m_idLeft  = (long)m_rm->AddNode();
		m_idRight = (long)m_rm->AddNode();
		RMNode & leftNode  = m_rm->m_nodes[m_idLeft];	
		RMNode & rightNode = m_rm->m_nodes[m_idRight];
		leftNode.m_id      = m_idLeft;
		rightNode.m_id     = m_idRight;
		leftNode.m_bBox    = m_bBox;
		rightNode.m_bBox   = m_bBox;
		leftNode.m_rm	   = m_rm;
		rightNode.m_rm	   = m_rm;

		if ( split == RMSplitAxis_X)
		{
			leftNode.m_bBox.m_max.X() = leftNode.m_bBox.m_max.X() - d.X() * 0.5;
			rightNode.m_bBox.m_min.X() = leftNode.m_bBox.m_max.X();
		}
		else if ( split == RMSplitAxis_Y)
		{
			leftNode.m_bBox.m_max.Y() = leftNode.m_bBox.m_max.Y() - d.Y() * 0.5;
			rightNode.m_bBox.m_min.Y() = leftNode.m_bBox.m_max.Y();
		}
		else
		{
			leftNode.m_bBox.m_max.Z() = leftNode.m_bBox.m_max.Z() - d.Z() * 0.5;
			rightNode.m_bBox.m_min.Z() = leftNode.m_bBox.m_max.Z();
		}
		long f;
		long pts[3];
		long v;
		Vec3<long> * const triangles = m_rm->m_triangles;			
		Vec3<Float> * const vertices = m_rm->m_vertices;
		leftNode.m_triIDs.Resize(m_triIDs.Size());
		rightNode.m_triIDs.Resize(m_triIDs.Size());
		bool found;
		for(size_t id = 0; id < m_triIDs.Size(); ++id)
		{
			f = m_triIDs[id];
			pts[0] = triangles[f].X();
            pts[1] = triangles[f].Y();
            pts[2] = triangles[f].Z();

			found = false;
			for (int k = 0; k < 3; ++k)
			{
				v = pts[k];
				if ( vertices[v].X() <= leftNode.m_bBox.m_max.X() && 
					 vertices[v].X() >= leftNode.m_bBox.m_min.X() &&
					 vertices[v].Y() <= leftNode.m_bBox.m_max.Y() && 
					 vertices[v].Y() >= leftNode.m_bBox.m_min.Y() &&
					 vertices[v].Z() <= leftNode.m_bBox.m_max.Z() && 
					 vertices[v].Z() >= leftNode.m_bBox.m_min.Z() )
				{
					leftNode.m_triIDs.PushBack(f);
					found = true;
					break;
				}
			}
			if (!found)
			{
				for (int k = 0; k < 3; ++k)
				{
					v = pts[k];
					if ( vertices[v].X() <= rightNode.m_bBox.m_max.X() && 
						 vertices[v].X() >= rightNode.m_bBox.m_min.X() &&
						 vertices[v].Y() <= rightNode.m_bBox.m_max.Y() && 
						 vertices[v].Y() >= rightNode.m_bBox.m_min.Y() &&
						 vertices[v].Z() <= rightNode.m_bBox.m_max.Z() && 
						 vertices[v].Z() >= rightNode.m_bBox.m_min.Z() )
					{
						rightNode.m_triIDs.PushBack(f);
						break;
					}
				}		
			}
		}
		rightNode.Create(depth+1, maxDepth, minLeafSize, minAxisSize);
		leftNode.Create(depth+1, maxDepth, minLeafSize, minAxisSize);
		m_triIDs.Clear();
	}